

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetGlobalCentreOfPressureAtSample
          (VClient *this,uint i_PlateID,uint i_Subsample,double (*o_rLocation) [3])

{
  bool bVar1;
  const_reference pvVar2;
  iterator __result;
  iterator __result_00;
  pointer i_Translation;
  array<double,_3UL> local_128;
  array<double,_3UL> local_110;
  undefined1 auStack_f8 [8];
  array<double,_3UL> WorldLocationVector;
  undefined1 local_d8 [8];
  array<double,_3UL> WorldTranslation;
  array<double,_9UL> WorldRotation;
  VForcePlateInfo *rForcePlate;
  uint local_68;
  Enum local_64;
  uint PlateIndex;
  Enum Result;
  array<double,_3UL> LocationVector;
  undefined1 local_38 [8];
  scoped_lock Lock;
  double (*o_rLocation_local) [3];
  uint i_Subsample_local;
  uint i_PlateID_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rLocation;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38,&this->m_FrameMutex);
  ClientUtils::Clear<double,3u>((double (*) [3])Lock._8_8_);
  local_64 = GetCentreOfPressure(this,i_PlateID,i_Subsample,(array<double,_3UL> *)&PlateIndex);
  if (local_64 == Success) {
    bVar1 = ForcePlateDeviceIndex(this,i_PlateID,&local_68);
    if (!bVar1) {
      this_local._4_4_ = Unknown;
      goto LAB_00139f39;
    }
    pvVar2 = std::
             vector<ViconCGStream::VForcePlateInfo,_std::allocator<ViconCGStream::VForcePlateInfo>_>
             ::operator[](&(this->m_LatestFrame).m_ForcePlates,(ulong)local_68);
    __result = std::array<double,_9UL>::begin((array<double,_9UL> *)(WorldTranslation._M_elems + 2))
    ;
    std::copy<float_const*,double*>(pvVar2->m_WorldRotation,pvVar2->m_Bounds,__result);
    __result_00 = std::array<double,_3UL>::begin((array<double,_3UL> *)local_d8);
    std::copy<float_const*,double*>(pvVar2->m_WorldTranslation,pvVar2->m_WorldRotation,__result_00);
    ClientUtils::operator/=((array<double,_3UL> *)local_d8,1000.0);
    ClientUtils::operator*
              (&local_128,(array<double,_9UL> *)(WorldTranslation._M_elems + 2),
               (array<double,_3UL> *)&PlateIndex);
    ClientUtils::operator+(&local_110,&local_128,(array<double,_3UL> *)local_d8);
    WorldLocationVector._M_elems[1] = local_110._M_elems[2];
    auStack_f8 = (undefined1  [8])local_110._M_elems[0];
    WorldLocationVector._M_elems[0] = local_110._M_elems[1];
    i_Translation = std::array<double,_3UL>::data((array<double,_3UL> *)auStack_f8);
    CopyAndTransformT(this,i_Translation,(double (*) [3])Lock._8_8_);
  }
  this_local._4_4_ = local_64;
LAB_00139f39:
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38);
  return this_local._4_4_;
}

Assistant:

Result::Enum VClient::GetGlobalCentreOfPressureAtSample( const unsigned int i_PlateID,
                                                 const unsigned int i_Subsample, 
                                                 double ( & o_rLocation )[3] ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  
  Clear( o_rLocation );

  std::array< double, 3 > LocationVector;
  Result::Enum Result = GetCentreOfPressure( i_PlateID, i_Subsample, LocationVector );

  if( Result == Result::Success )
  {
    unsigned int PlateIndex;
    if( !ForcePlateDeviceIndex( i_PlateID, PlateIndex ) )
    {
      return Result::Unknown;
    }

    const ViconCGStream::VForcePlateInfo & rForcePlate = m_LatestFrame.m_ForcePlates[ PlateIndex ];

    std::array< double, 3 * 3 > WorldRotation;
    std::copy( rForcePlate.m_WorldRotation, rForcePlate.m_WorldRotation + 9, WorldRotation.begin() );

    std::array< double, 3 > WorldTranslation;
    std::copy( rForcePlate.m_WorldTranslation, rForcePlate.m_WorldTranslation + 3, WorldTranslation.begin() );

    // Force Plate Info is in mm.  Result CoP is in meters.
    WorldTranslation /= 1000.0;

    std::array< double, 3 > WorldLocationVector;

    WorldLocationVector = WorldRotation * LocationVector + WorldTranslation;

    CopyAndTransformT( WorldLocationVector.data(), o_rLocation );
  }

  return Result;
}